

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O1

void google::protobuf::compiler::WriteShort(CodedOutputStream *out,uint16_t val)

{
  uint16_t *puVar1;
  uint8_t p [2];
  uint16_t local_a;
  
  puVar1 = (uint16_t *)out->cur_;
  if ((long)(out->impl_).end_ - (long)puVar1 < 2) {
    local_a = val;
    puVar1 = (uint16_t *)
             io::EpsCopyOutputStream::WriteRawFallback(&out->impl_,&local_a,2,(uint8_t *)puVar1);
  }
  else {
    *puVar1 = val;
    puVar1 = puVar1 + 1;
  }
  out->cur_ = (uint8_t *)puVar1;
  return;
}

Assistant:

static void WriteShort(io::CodedOutputStream* out, uint16_t val) {
  uint8_t p[2];
  p[0] = static_cast<uint8_t>(val);
  p[1] = static_cast<uint8_t>(val >> 8);
  out->WriteRaw(p, 2);
}